

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDyndepCollation.cxx
# Opt level: O3

unique_ptr<cmCxxModuleExportInfo,_cmCxxModuleExportInfoDeleter> __thiscall
cmDyndepCollation::ParseExportInfo(cmDyndepCollation *this,Value *tdi)

{
  _Rb_tree_header *p_Var1;
  string *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  pointer pcVar4;
  bool bVar5;
  cmFileSetVisibility cVar6;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>_>_>
  *this_01;
  Value *pVVar7;
  Value *pVVar8;
  mapped_type *this_02;
  Value *pVVar9;
  const_iterator cVar10;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view name;
  CxxModuleExport exp;
  String local_150;
  undefined1 *local_130;
  undefined8 local_128;
  ValueHolder local_120;
  size_t local_118;
  undefined1 *local_110;
  undefined1 local_108 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_100;
  undefined8 local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  undefined8 local_e0;
  undefined1 *local_d8;
  ulong local_d0;
  undefined1 local_c8;
  undefined7 uStack_c7;
  ulong *local_c0;
  undefined1 *local_b8;
  ulong local_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  ulong *local_a0;
  _Rb_tree_node_base *local_98;
  ulong local_90;
  _Rb_tree_node_base local_88;
  _Base_ptr *local_68;
  SelfType local_60;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  this_01 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>_>_>
             *)operator_new(0x118);
  p_Var1 = &(this_01->_M_t)._M_impl.super__Rb_tree_header;
  (this_01->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this_01->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this_01->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this_01->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this_01->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined1 *)&this_01[4]._M_t._M_impl.super__Rb_tree_header._M_header._M_left = 0;
  this_01[4]._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  this_01[4]._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&this_01[5]._M_t._M_impl = 0;
  *(_Base_ptr **)&this_01[5]._M_t._M_impl.super__Rb_tree_header._M_header =
       &this_01[5]._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  this_01[5]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  *(undefined1 *)&this_01[5]._M_t._M_impl.super__Rb_tree_header._M_header._M_left = 0;
  *(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>_>_>
    **)this = this_01;
  local_88._M_left = (_Base_ptr)tdi;
  local_88._M_right = (_Base_ptr)this;
  pVVar7 = Json::Value::operator[](tdi,"config");
  Json::Value::asString_abi_cxx11_((String *)&local_120,pVVar7);
  p_Var1 = &this_01[5]._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::string::operator=((string *)p_Var1,(string *)&local_120.bool_);
  if (local_120 != &local_110) {
    operator_delete(local_120.string_,(ulong)(local_110 + 1));
  }
  if (this_01[5]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    std::__cxx11::string::_M_replace((ulong)p_Var1,0,(char *)0x0,0x83eeb8);
  }
  pVVar7 = Json::Value::operator[]((Value *)local_88._M_left,"exports");
  bVar5 = Json::Value::isArray(pVVar7);
  if (bVar5) {
    cVar10 = Json::Value::begin(pVVar7);
    local_50._0_8_ = cVar10.super_ValueIteratorBase.current_._M_node;
    local_50[8] = cVar10.super_ValueIteratorBase.isNull_;
    cVar10 = Json::Value::end(pVVar7);
    local_60.current_ = cVar10.super_ValueIteratorBase.current_._M_node;
    local_68 = &this_01[4]._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    local_60.isNull_ = cVar10.super_ValueIteratorBase.isNull_;
    paVar2 = &local_150.field_2;
    while( true ) {
      bVar5 = Json::ValueIteratorBase::isEqual((ValueIteratorBase *)local_50,&local_60);
      if (bVar5) break;
      pVVar7 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_50);
      local_118 = 0;
      local_110 = (undefined1 *)((ulong)local_110 & 0xffffffffffffff00);
      local_100 = &local_f0;
      local_f8 = 0;
      local_f0._M_local_buf[0] = '\0';
      local_e0 = &local_d0;
      local_d8 = (undefined1 *)0x0;
      local_d0 = local_d0 & 0xffffffffffffff00;
      local_c0 = &local_b0;
      local_b8 = (undefined1 *)0x0;
      local_b0 = local_b0 & 0xffffffffffffff00;
      local_a0 = &local_90;
      local_98 = (_Rb_tree_node_base *)0x0;
      local_90 = local_90 & 0xffffffffffffff00;
      local_120.string_ = (char *)&local_110;
      pVVar8 = Json::Value::operator[](pVVar7,"install");
      local_88._M_parent._0_1_ = Json::Value::asBool(pVVar8);
      pVVar8 = Json::Value::operator[](pVVar7,"export-name");
      Json::Value::asString_abi_cxx11_(&local_150,pVVar8);
      std::__cxx11::string::operator=((string *)&local_120.bool_,(string *)&local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != paVar2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      pVVar8 = Json::Value::operator[](pVVar7,"destination");
      Json::Value::asString_abi_cxx11_(&local_150,pVVar8);
      std::__cxx11::string::operator=((string *)&local_100,(string *)&local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != paVar2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      pVVar8 = Json::Value::operator[](pVVar7,"export-prefix");
      Json::Value::asString_abi_cxx11_(&local_150,pVVar8);
      std::__cxx11::string::operator=((string *)&local_e0,(string *)&local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != paVar2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      pVVar8 = Json::Value::operator[](pVVar7,"cxx-module-info-dir");
      Json::Value::asString_abi_cxx11_(&local_150,pVVar8);
      std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != paVar2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      pVVar7 = Json::Value::operator[](pVVar7,"namespace");
      Json::Value::asString_abi_cxx11_(&local_150,pVVar7);
      std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != paVar2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      std::vector<CxxModuleExport,_std::allocator<CxxModuleExport>_>::push_back
                ((vector<CxxModuleExport,_std::allocator<CxxModuleExport>_> *)local_68,
                 (value_type *)&local_120);
      if (local_a0 != &local_90) {
        operator_delete(local_a0,local_90 + 1);
      }
      if (local_c0 != &local_b0) {
        operator_delete(local_c0,local_b0 + 1);
      }
      if (local_e0 != &local_d0) {
        operator_delete(local_e0,local_d0 + 1);
      }
      if (local_100 != &local_f0) {
        operator_delete(local_100,
                        CONCAT71(local_f0._M_allocated_capacity._1_7_,local_f0._M_local_buf[0]) + 1)
        ;
      }
      if (local_120 != &local_110) {
        operator_delete(local_120.string_,(ulong)(local_110 + 1));
      }
      Json::ValueIteratorBase::increment((ValueIteratorBase *)local_50);
    }
  }
  pVVar7 = Json::Value::operator[]((Value *)local_88._M_left,"bmi-installation");
  bVar5 = Json::Value::isObject(pVVar7);
  if (bVar5) {
    local_118 = 0;
    local_110 = (undefined1 *)((ulong)local_110 & 0xffffffffffffff00);
    local_f8 = 0;
    local_f0._M_local_buf[0] = '\0';
    local_d8 = &local_c8;
    local_d0 = 0;
    local_c8 = 0;
    local_b8 = &local_a8;
    local_b0 = 0;
    local_a8 = 0;
    local_90 = 0;
    local_88._M_color._0_1_ = _S_red;
    local_120.string_ = (char *)&local_110;
    local_100 = &local_f0;
    local_98 = &local_88;
    pVVar8 = Json::Value::operator[](pVVar7,"component");
    Json::Value::asString_abi_cxx11_(&local_150,pVVar8);
    std::__cxx11::string::operator=((string *)&local_120.bool_,(string *)&local_150);
    paVar2 = &local_150.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    pVVar8 = Json::Value::operator[](pVVar7,"destination");
    Json::Value::asString_abi_cxx11_(&local_150,pVVar8);
    std::__cxx11::string::operator=((string *)&local_100,(string *)&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    pVVar8 = Json::Value::operator[](pVVar7,"exclude-from-all");
    bVar5 = Json::Value::asBool(pVVar8);
    local_e0 = (ulong *)CONCAT71(local_e0._1_7_,bVar5);
    pVVar8 = Json::Value::operator[](pVVar7,"optional");
    bVar5 = Json::Value::asBool(pVVar8);
    local_e0._0_2_ = CONCAT11(bVar5,local_e0._0_1_);
    pVVar8 = Json::Value::operator[](pVVar7,"permissions");
    Json::Value::asString_abi_cxx11_(&local_150,pVVar8);
    std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    pVVar8 = Json::Value::operator[](pVVar7,"message-level");
    Json::Value::asString_abi_cxx11_(&local_150,pVVar8);
    std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    pVVar7 = Json::Value::operator[](pVVar7,"script-location");
    Json::Value::asString_abi_cxx11_(&local_150,pVVar7);
    std::__cxx11::string::operator=((string *)&local_98,(string *)&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    std::optional<CxxModuleBmiInstall>::operator=
              ((optional<CxxModuleBmiInstall> *)(this_01 + 1),(CxxModuleBmiInstall *)&local_120);
    if (local_98 != &local_88) {
      operator_delete(local_98,CONCAT71(local_88._1_7_,(undefined1)local_88._M_color) + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
    }
    if (local_100 != &local_f0) {
      operator_delete(local_100,
                      CONCAT71(local_f0._M_allocated_capacity._1_7_,local_f0._M_local_buf[0]) + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120.string_,(ulong)(local_110 + 1));
    }
  }
  pVVar7 = Json::Value::operator[]((Value *)local_88._M_left,"cxx-modules");
  bVar5 = Json::Value::isObject(pVVar7);
  if (bVar5) {
    cVar10 = Json::Value::begin(pVVar7);
    local_60.current_ = cVar10.super_ValueIteratorBase.current_._M_node;
    local_60.isNull_ = cVar10.super_ValueIteratorBase.isNull_;
    while( true ) {
      cVar10 = Json::Value::end(pVVar7);
      local_120.int_ = (LargestInt)cVar10.super_ValueIteratorBase.current_._M_node;
      local_118 = CONCAT71(local_118._1_7_,cVar10.super_ValueIteratorBase.isNull_);
      bVar5 = Json::ValueIteratorBase::isEqual(&local_60,(SelfType *)&local_120);
      if (bVar5) break;
      Json::ValueIteratorBase::key((Value *)&local_120,&local_60);
      Json::Value::asString_abi_cxx11_(&local_150,(Value *)&local_120);
      this_02 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>_>_>
                ::operator[](this_01,&local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      Json::Value::~Value((Value *)&local_120);
      pVVar8 = Json::ValueIteratorBase::deref(&local_60);
      pVVar9 = Json::Value::operator[](pVVar8,"name");
      Json::Value::asString_abi_cxx11_((String *)&local_120,pVVar9);
      std::__cxx11::string::operator=((string *)this_02,(string *)&local_120.bool_);
      if (local_120 != &local_110) {
        operator_delete(local_120.string_,(ulong)(local_110 + 1));
      }
      pVVar9 = Json::Value::operator[](pVVar8,"bmi-only");
      bVar5 = Json::Value::asBool(pVVar9);
      this_02->BmiOnly = bVar5;
      pVVar9 = Json::Value::operator[](pVVar8,"relative-directory");
      Json::Value::asString_abi_cxx11_((String *)&local_120,pVVar9);
      this_00 = &this_02->RelativeDirectory;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_120.bool_);
      if (local_120 != &local_110) {
        operator_delete(local_120.string_,(ulong)(local_110 + 1));
      }
      pcVar3 = (pointer)(this_02->RelativeDirectory)._M_string_length;
      if ((pcVar3 != (pointer)0x0) &&
         (pcVar4 = (this_00->_M_dataplus)._M_p, pcVar3[(long)(pcVar4 + -1)] != '/')) {
        local_150.field_2._M_allocated_capacity = 0;
        local_120.int_ = 0;
        local_118 = 1;
        local_130 = local_108;
        local_108[0] = 0x2f;
        local_150.field_2._8_8_ = 1;
        local_128 = 0;
        views._M_len = 2;
        views._M_array = (iterator)&local_150;
        local_150._M_dataplus._M_p = pcVar3;
        local_150._M_string_length = (size_type)pcVar4;
        local_110 = local_130;
        cmCatViews((string *)local_50,views);
        std::__cxx11::string::operator=((string *)this_00,(string *)local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._0_8_ != &local_40) {
          operator_delete((void *)local_50._0_8_,local_40._M_allocated_capacity + 1);
        }
      }
      pVVar9 = Json::Value::operator[](pVVar8,"source");
      Json::Value::asString_abi_cxx11_((String *)&local_120,pVVar9);
      std::__cxx11::string::operator=((string *)&this_02->SourcePath,(string *)&local_120.bool_);
      if (local_120 != &local_110) {
        operator_delete(local_120.string_,(ulong)(local_110 + 1));
      }
      pVVar9 = Json::Value::operator[](pVVar8,"type");
      Json::Value::asString_abi_cxx11_((String *)&local_120,pVVar9);
      std::__cxx11::string::operator=((string *)&this_02->Type,(string *)&local_120.bool_);
      if (local_120 != &local_110) {
        operator_delete(local_120.string_,(ulong)(local_110 + 1));
      }
      pVVar9 = Json::Value::operator[](pVVar8,"visibility");
      Json::Value::asString_abi_cxx11_((String *)&local_120,pVVar9);
      name._M_str = local_120.string_;
      name._M_len = local_118;
      cVar6 = cmFileSetVisibilityFromName(name,(cmMakefile *)0x0);
      this_02->Visibility = cVar6;
      if (local_120 != &local_110) {
        operator_delete(local_120.string_,(ulong)(local_110 + 1));
      }
      pVVar8 = Json::Value::operator[](pVVar8,"destination");
      bVar5 = Json::Value::isString(pVVar8);
      if (bVar5) {
        Json::Value::asString_abi_cxx11_((String *)&local_120,pVVar8);
        std::optional<std::__cxx11::string>::operator=
                  ((optional<std::__cxx11::string> *)&this_02->Destination,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_120);
        if (local_120 != &local_110) {
          operator_delete(local_120.string_,(ulong)(local_110 + 1));
        }
      }
      Json::ValueIteratorBase::increment(&local_60);
    }
  }
  return (__uniq_ptr_data<cmCxxModuleExportInfo,_cmCxxModuleExportInfoDeleter,_true,_true>)
         (tuple<cmCxxModuleExportInfo_*,_cmCxxModuleExportInfoDeleter>)local_88._M_right;
}

Assistant:

std::unique_ptr<cmCxxModuleExportInfo, cmCxxModuleExportInfoDeleter>
cmDyndepCollation::ParseExportInfo(Json::Value const& tdi)
{
  auto export_info =
    std::unique_ptr<cmCxxModuleExportInfo, cmCxxModuleExportInfoDeleter>(
      new cmCxxModuleExportInfo);

  export_info->Config = tdi["config"].asString();
  if (export_info->Config.empty()) {
    export_info->Config = "noconfig";
  }
  Json::Value const& tdi_exports = tdi["exports"];
  if (tdi_exports.isArray()) {
    for (auto const& tdi_export : tdi_exports) {
      CxxModuleExport exp;
      exp.Install = tdi_export["install"].asBool();
      exp.Name = tdi_export["export-name"].asString();
      exp.Destination = tdi_export["destination"].asString();
      exp.Prefix = tdi_export["export-prefix"].asString();
      exp.CxxModuleInfoDir = tdi_export["cxx-module-info-dir"].asString();
      exp.Namespace = tdi_export["namespace"].asString();

      export_info->Exports.push_back(exp);
    }
  }
  auto const& bmi_installation = tdi["bmi-installation"];
  if (bmi_installation.isObject()) {
    CxxModuleBmiInstall bmi_install;

    bmi_install.Component = bmi_installation["component"].asString();
    bmi_install.Destination = bmi_installation["destination"].asString();
    bmi_install.ExcludeFromAll = bmi_installation["exclude-from-all"].asBool();
    bmi_install.Optional = bmi_installation["optional"].asBool();
    bmi_install.Permissions = bmi_installation["permissions"].asString();
    bmi_install.MessageLevel = bmi_installation["message-level"].asString();
    bmi_install.ScriptLocation =
      bmi_installation["script-location"].asString();

    export_info->BmiInstallation = bmi_install;
  }
  Json::Value const& tdi_cxx_modules = tdi["cxx-modules"];
  if (tdi_cxx_modules.isObject()) {
    for (auto i = tdi_cxx_modules.begin(); i != tdi_cxx_modules.end(); ++i) {
      CxxModuleFileSet& fsi = export_info->ObjectToFileSet[i.key().asString()];
      auto const& tdi_cxx_module_info = *i;
      fsi.Name = tdi_cxx_module_info["name"].asString();
      fsi.BmiOnly = tdi_cxx_module_info["bmi-only"].asBool();
      fsi.RelativeDirectory =
        tdi_cxx_module_info["relative-directory"].asString();
      if (!fsi.RelativeDirectory.empty() &&
          fsi.RelativeDirectory.back() != '/') {
        fsi.RelativeDirectory = cmStrCat(fsi.RelativeDirectory, '/');
      }
      fsi.SourcePath = tdi_cxx_module_info["source"].asString();
      fsi.Type = tdi_cxx_module_info["type"].asString();
      fsi.Visibility = cmFileSetVisibilityFromName(
        tdi_cxx_module_info["visibility"].asString(), nullptr);
      auto const& tdi_fs_dest = tdi_cxx_module_info["destination"];
      if (tdi_fs_dest.isString()) {
        fsi.Destination = tdi_fs_dest.asString();
      }
    }
  }

  return export_info;
}